

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void anon_unknown.dwarf_1485b::iDrawQuadrangle(Vec3 *a,Vec3 *b,Vec3 *c,Vec3 *d,Color *color)

{
  PFNGLCOLOR3FPROC p_Var1;
  int in_ECX;
  void *extraout_RDX;
  void *in_RSI;
  Color *in_R8;
  Color *pCVar2;
  int in_R9D;
  GLfloat extraout_XMM0_Da;
  float fVar3;
  float fVar4;
  int in_stack_ffffffffffffffb8;
  
  pCVar2 = in_R8;
  OpenSteer::warnIfInUpdatePhase((char *)0x119e09);
  p_Var1 = glad_glColor3f;
  OpenSteer::Color::r(in_R8,in_RSI,extraout_RDX,in_ECX,(char *)pCVar2,in_R9D,
                      in_stack_ffffffffffffffb8);
  fVar3 = OpenSteer::Color::g(in_R8);
  fVar4 = OpenSteer::Color::b(in_R8);
  (*p_Var1)(extraout_XMM0_Da,fVar3,fVar4);
  (*glad_glBegin)(7);
  OpenSteer::glVertexVec3((Vec3 *)0x119e70);
  OpenSteer::glVertexVec3((Vec3 *)0x119e7a);
  OpenSteer::glVertexVec3((Vec3 *)0x119e84);
  OpenSteer::glVertexVec3((Vec3 *)0x119e8e);
  (*glad_glEnd)();
  return;
}

Assistant:

inline void iDrawQuadrangle (const OpenSteer::Vec3& a,
                                 const OpenSteer::Vec3& b,
                                 const OpenSteer::Vec3& c,
                                 const OpenSteer::Vec3& d,
                                 const OpenSteer::Color& color)
    {
        OpenSteer::warnIfInUpdatePhase ("iDrawQuadrangle");
        glColor3f (color.r(), color.g(), color.b());
        glBegin (GL_QUADS);
        {
            OpenSteer::glVertexVec3 (a);
            OpenSteer::glVertexVec3 (b);
            OpenSteer::glVertexVec3 (c);
            OpenSteer::glVertexVec3 (d);
        }
        glEnd ();
    }